

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

void __thiscall
slang::ast::SequenceWithMatchExpr::serializeTo
          (SequenceWithMatchExpr *this,ASTSerializer *serializer)

{
  pointer ppEVar1;
  size_type sVar2;
  long lVar3;
  string_view name;
  string_view name_00;
  
  ASTSerializer::write(serializer,4,"expr",(size_t)this->expr);
  if ((this->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::SequenceRepetition>._M_engaged == true) {
    name._M_str = "repetition";
    name._M_len = 10;
    ASTSerializer::writeProperty(serializer,name);
    SequenceRepetition::serializeTo((SequenceRepetition *)&this->repetition,serializer);
  }
  name_00._M_str = "matchItems";
  name_00._M_len = 10;
  ASTSerializer::startArray(serializer,name_00);
  ppEVar1 = (this->matchItems).data_;
  sVar2 = (this->matchItems).size_;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar1 + lVar3));
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void SequenceWithMatchExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.write("expr", expr);
    if (repetition) {
        serializer.writeProperty("repetition");
        repetition->serializeTo(serializer);
    }

    serializer.startArray("matchItems");
    for (auto item : matchItems)
        serializer.serialize(*item);
    serializer.endArray();
}